

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::CmdBase::CmdBase
          (CmdBase *this,string *name,string *alternative,string *description,bool required)

{
  allocator_type local_3b;
  allocator local_3a;
  allocator local_39;
  string *local_38;
  
  this->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_00139898;
  local_38 = &this->name;
  std::__cxx11::string::string((string *)local_38,(string *)name);
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->command,"",&local_39);
  }
  else {
    std::operator+(&this->command,"-",name);
  }
  if (alternative->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->alternative,"",&local_3a);
  }
  else {
    std::operator+(&this->alternative,"--",alternative);
  }
  std::__cxx11::string::string((string *)&this->description,(string *)description);
  this->required = required;
  this->handled = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->arguments,
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )ZEXT816(0),&local_3b);
  return;
}

Assistant:

explicit CmdBase(const std::string& name, const std::string& alternative, const std::string& description, bool required) : 
				name(name),
				command(name.size() > 0 ? "-" + name : ""),
				alternative(alternative.size() > 0 ? "--" + alternative : ""),
				description(description),
				required(required),
				handled(false),
				arguments({}) {
			}